

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_size_tests.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_183fe20::AV1ResolutionChange_InvalidInputSize_Test::TestBody
          (AV1ResolutionChange_InvalidInputSize_Test *this)

{
  undefined8 *puVar1;
  aom_codec_err_t aVar2;
  int iVar3;
  aom_codec_iface_t *iface;
  aom_codec_cx_pkt_t *lhs;
  long lVar4;
  aom_image_t *paVar5;
  SEARCH_METHODS *pSVar6;
  bool bVar7;
  aom_codec_iter_t iter;
  AssertionResult gtest_ar_3;
  int frame_count;
  RandomVideoSource video;
  aom_codec_ctx_t ctx;
  aom_codec_enc_cfg_t cfg;
  AssertHelper local_470;
  AssertHelper local_468;
  AssertHelper local_460;
  undefined8 *local_458;
  int local_44c;
  AssertHelper local_448;
  RandomVideoSource local_440;
  AV1ResolutionChange_InvalidInputSize_Test *local_408;
  _func_int **local_400;
  long local_3f8;
  aom_codec_ctx_t local_3f0;
  aom_codec_enc_cfg_t local_3b8;
  
  iface = aom_codec_av1_cx();
  local_408 = this;
  local_440.super_DummyVideoSource.super_VideoSource._vptr_VideoSource._0_4_ =
       aom_codec_enc_config_default(iface,&local_3b8,(this->super_AV1ResolutionChange).usage_);
  local_460.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            ((internal *)&local_3f0,"aom_codec_enc_config_default(iface, &cfg, usage_)",
             "AOM_CODEC_OK",(aom_codec_err_t *)&local_440,(aom_codec_err_t *)&local_460);
  if ((char)local_3f0.name == '\0') {
    testing::Message::Message((Message *)&local_440);
    if (local_3f0.iface == (aom_codec_iface_t *)0x0) {
      pSVar6 = "";
    }
    else {
      pSVar6 = (SEARCH_METHODS *)(local_3f0.iface)->name;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_460,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
               ,0xfc,(char *)pSVar6);
    testing::internal::AssertHelper::operator=(&local_460,(Message *)&local_440);
    testing::internal::AssertHelper::~AssertHelper(&local_460);
    if (local_440.super_DummyVideoSource.super_VideoSource._vptr_VideoSource != (_func_int **)0x0) {
      (**(code **)(*local_440.super_DummyVideoSource.super_VideoSource._vptr_VideoSource + 8))();
    }
    if (local_3f0.iface != (aom_codec_iface_t *)0x0) {
      if ((aom_codec_caps_t *)(local_3f0.iface)->name != &(local_3f0.iface)->caps) {
        operator_delete((local_3f0.iface)->name);
      }
      operator_delete(local_3f0.iface);
    }
  }
  else {
    if (local_3f0.iface != (aom_codec_iface_t *)0x0) {
      if ((aom_codec_caps_t *)(local_3f0.iface)->name != &(local_3f0.iface)->caps) {
        operator_delete((local_3f0.iface)->name);
      }
      operator_delete(local_3f0.iface);
    }
    local_3b8.g_pass = AOM_RC_ONE_PASS;
    local_3b8.g_lag_in_frames = 0;
    local_3b8.rc_end_usage = (local_408->super_AV1ResolutionChange).rc_mode_;
    local_460.data_._0_4_ = aom_codec_enc_init_ver(&local_3f0,iface,&local_3b8,0,0x1d);
    local_470.data_ = (AssertHelperData *)((ulong)local_470.data_._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
              ((internal *)&local_440,
               "aom_codec_enc_init_ver(&ctx, iface, &cfg, 0, (10 + (7 + (9)) + 3))","AOM_CODEC_OK",
               (aom_codec_err_t *)&local_460,(aom_codec_err_t *)&local_470);
    if ((char)local_440.super_DummyVideoSource.super_VideoSource._vptr_VideoSource == '\0') {
      testing::Message::Message((Message *)&local_460);
      if (local_440.super_DummyVideoSource.img_ == (aom_image_t *)0x0) {
        pSVar6 = "";
      }
      else {
        pSVar6 = *(SEARCH_METHODS **)local_440.super_DummyVideoSource.img_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_470,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
                 ,0x104,(char *)pSVar6);
      testing::internal::AssertHelper::operator=(&local_470,(Message *)&local_460);
      testing::internal::AssertHelper::~AssertHelper(&local_470);
      if ((long *)CONCAT44(local_460.data_._4_4_,(aom_codec_err_t)local_460.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_460.data_._4_4_,(aom_codec_err_t)local_460.data_) + 8))
                  ();
      }
    }
    paVar5 = local_440.super_DummyVideoSource.img_;
    if (local_440.super_DummyVideoSource.img_ != (aom_image_t *)0x0) {
      if ((int *)*(undefined1 **)local_440.super_DummyVideoSource.img_ !=
          &(local_440.super_DummyVideoSource.img_)->monochrome) {
        operator_delete(*(undefined1 **)local_440.super_DummyVideoSource.img_);
      }
      operator_delete(paVar5);
    }
    local_460.data_._0_4_ =
         aom_codec_control(&local_3f0,0xd,
                           (ulong)(uint)(local_408->super_AV1ResolutionChange).cpu_used_);
    local_470.data_ = local_470.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
              ((internal *)&local_440,"aom_codec_control(enc.get(), AOME_SET_CPUUSED, cpu_used_)",
               "AOM_CODEC_OK",(aom_codec_err_t *)&local_460,(aom_codec_err_t *)&local_470);
    if ((char)local_440.super_DummyVideoSource.super_VideoSource._vptr_VideoSource == '\0') {
      testing::Message::Message((Message *)&local_460);
      if (local_440.super_DummyVideoSource.img_ == (aom_image_t *)0x0) {
        pSVar6 = "";
      }
      else {
        pSVar6 = *(SEARCH_METHODS **)local_440.super_DummyVideoSource.img_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_470,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
                 ,0x108,(char *)pSVar6);
      testing::internal::AssertHelper::operator=(&local_470,(Message *)&local_460);
      testing::internal::AssertHelper::~AssertHelper(&local_470);
      if ((long *)CONCAT44(local_460.data_._4_4_,(aom_codec_err_t)local_460.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_460.data_._4_4_,(aom_codec_err_t)local_460.data_) + 8))
                  ();
      }
    }
    if (local_440.super_DummyVideoSource.img_ != (aom_image_t *)0x0) {
      if ((int *)*(undefined1 **)local_440.super_DummyVideoSource.img_ !=
          &(local_440.super_DummyVideoSource.img_)->monochrome) {
        operator_delete(*(undefined1 **)local_440.super_DummyVideoSource.img_);
      }
      operator_delete(local_440.super_DummyVideoSource.img_);
    }
    local_44c = 0;
    local_400 = (_func_int **)&PTR__DummyVideoSource_01074718;
    local_440.super_DummyVideoSource.super_VideoSource._vptr_VideoSource =
         (_func_int **)&PTR__DummyVideoSource_01074718;
    local_440.super_DummyVideoSource.img_ = (aom_image_t *)0x0;
    local_440.super_DummyVideoSource.limit_ = 100;
    local_440.super_DummyVideoSource.width_ = 0x50;
    local_440.super_DummyVideoSource.height_ = 0x40;
    local_440.super_DummyVideoSource.format_ = AOM_IMG_FMT_I420;
    libaom_test::DummyVideoSource::ReallocImage(&local_440.super_DummyVideoSource);
    local_440.super_DummyVideoSource.super_VideoSource._vptr_VideoSource =
         (_func_int **)&PTR__DummyVideoSource_01087218;
    local_440.super_DummyVideoSource._44_4_ = 0xbaba;
    local_440.seed_ = 0xbaba;
    local_440.super_DummyVideoSource.frame_ = 0;
    libaom_test::RandomVideoSource::FillFrame(&local_440);
    lVar4 = 0;
    do {
      local_3b8.g_w = *(uint *)((long)&TestBody::kFrameSizes._M_elems[0].width + lVar4);
      local_3b8.g_h = *(uint *)((long)&TestBody::kFrameSizes._M_elems[0].height + lVar4);
      local_3f8 = lVar4;
      if (local_3b8.g_h - 0x10001 < 0xffff0000 || local_3b8.g_w - 0x10001 < 0xffff0000) {
        aVar2 = aom_codec_enc_config_set(&local_3f0,&local_3b8);
        local_470.data_._0_4_ = aVar2;
        local_468.data_._0_4_ = AOM_CODEC_INVALID_PARAM;
        testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                  ((internal *)&local_460,"aom_codec_enc_config_set(enc.get(), &cfg)",
                   "AOM_CODEC_INVALID_PARAM",(aom_codec_err_t *)&local_470,
                   (aom_codec_err_t *)&local_468);
        if (local_460.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_470);
          pSVar6 = "";
          if (local_458 != (undefined8 *)0x0) {
            pSVar6 = (SEARCH_METHODS *)*local_458;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_468,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
                     ,0x113,(char *)pSVar6);
          testing::internal::AssertHelper::operator=(&local_468,(Message *)&local_470);
          testing::internal::AssertHelper::~AssertHelper(&local_468);
          if (local_470.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_470.data_ + 8))();
          }
        }
        puVar1 = local_458;
        if (local_458 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_458 != local_458 + 2) {
            operator_delete((undefined8 *)*local_458);
          }
          operator_delete(puVar1);
        }
        iVar3 = 3;
      }
      else {
        aVar2 = aom_codec_enc_config_set(&local_3f0,&local_3b8);
        local_470.data_._0_4_ = aVar2;
        local_468.data_._0_4_ = AOM_CODEC_OK;
        testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                  ((internal *)&local_460,"aom_codec_enc_config_set(enc.get(), &cfg)","AOM_CODEC_OK"
                   ,(aom_codec_err_t *)&local_470,(aom_codec_err_t *)&local_468);
        if (local_460.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_470);
          pSVar6 = "";
          if (local_458 != (undefined8 *)0x0) {
            pSVar6 = (SEARCH_METHODS *)*local_458;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_468,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
                     ,0x117,(char *)pSVar6);
          testing::internal::AssertHelper::operator=(&local_468,(Message *)&local_470);
          testing::internal::AssertHelper::~AssertHelper(&local_468);
          if (local_470.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_470.data_ + 8))();
          }
        }
        puVar1 = local_458;
        if (local_458 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_458 != local_458 + 2) {
            operator_delete((undefined8 *)*local_458);
          }
          operator_delete(puVar1);
        }
        if ((local_440.super_DummyVideoSource.width_ != local_3b8.g_w) ||
           (local_440.super_DummyVideoSource.height_ != local_3b8.g_h)) {
          local_440.super_DummyVideoSource.height_ = local_3b8.g_h;
          local_440.super_DummyVideoSource.width_ = local_3b8.g_w;
          libaom_test::DummyVideoSource::ReallocImage(&local_440.super_DummyVideoSource);
        }
        iVar3 = 0;
        do {
          local_440.super_DummyVideoSource.frame_ = local_440.super_DummyVideoSource.frame_ + 1;
          (*local_440.super_DummyVideoSource.super_VideoSource._vptr_VideoSource[10])(&local_440);
          paVar5 = (aom_image_t *)0x0;
          if (local_440.super_DummyVideoSource.frame_ < local_440.super_DummyVideoSource.limit_) {
            paVar5 = local_440.super_DummyVideoSource.img_;
          }
          local_468.data_._0_4_ =
               aom_codec_encode(&local_3f0,paVar5,(ulong)local_440.super_DummyVideoSource.frame_,1,0
                               );
          local_448.data_._0_4_ = 0;
          testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                    ((internal *)&local_460,
                     "aom_codec_encode(enc.get(), video.img(), video.pts(), video.duration(), 0)",
                     "AOM_CODEC_OK",(aom_codec_err_t *)&local_468,(aom_codec_err_t *)&local_448);
          if (local_460.data_._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_468);
            pSVar6 = "";
            if (local_458 != (undefined8 *)0x0) {
              pSVar6 = (SEARCH_METHODS *)*local_458;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_448,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
                       ,0x121,(char *)pSVar6);
            testing::internal::AssertHelper::operator=(&local_448,(Message *)&local_468);
            testing::internal::AssertHelper::~AssertHelper(&local_448);
            if ((long *)CONCAT44(local_468.data_._4_4_,(aom_codec_err_t)local_468.data_) !=
                (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_468.data_._4_4_,(aom_codec_err_t)local_468.data_)
                          + 8))();
            }
          }
          puVar1 = local_458;
          if (local_458 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_458 != local_458 + 2) {
              operator_delete((undefined8 *)*local_458);
            }
            operator_delete(puVar1);
          }
          local_470.data_ = (AssertHelperData *)0x0;
          while( true ) {
            lhs = aom_codec_get_cx_data(&local_3f0,&local_470.data_);
            if (lhs == (aom_codec_cx_pkt_t *)0x0) break;
            local_468.data_._0_4_ = AOM_CODEC_OK;
            testing::internal::CmpHelperEQ<aom_codec_cx_pkt_kind,aom_codec_cx_pkt_kind>
                      ((internal *)&local_460,"pkt->kind","AOM_CODEC_CX_FRAME_PKT",&lhs->kind,
                       (aom_codec_cx_pkt_kind *)&local_468);
            puVar1 = local_458;
            if (local_460.data_._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_468);
              pSVar6 = "";
              if (local_458 != (undefined8 *)0x0) {
                pSVar6 = (SEARCH_METHODS *)*local_458;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_448,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
                         ,0x125,(char *)pSVar6);
              testing::internal::AssertHelper::operator=(&local_448,(Message *)&local_468);
              testing::internal::AssertHelper::~AssertHelper(&local_448);
              if ((long *)CONCAT44(local_468.data_._4_4_,(aom_codec_err_t)local_468.data_) !=
                  (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_468.data_._4_4_,
                                               (aom_codec_err_t)local_468.data_) + 8))();
              }
              puVar1 = local_458;
              if (local_458 != (undefined8 *)0x0) {
                if ((undefined8 *)*local_458 != local_458 + 2) {
                  operator_delete((undefined8 *)*local_458);
                }
                operator_delete(puVar1);
              }
              iVar3 = 1;
              goto LAB_00679351;
            }
            if (local_458 != (undefined8 *)0x0) {
              if ((undefined8 *)*local_458 != local_458 + 2) {
                operator_delete((undefined8 *)*local_458);
              }
              operator_delete(puVar1);
            }
            if ((iVar3 == 0) || ((local_408->super_AV1ResolutionChange).usage_ == 2)) {
              local_468.data_._0_4_ = (lhs->data).frame.flags & AOM_CODEC_ERROR;
              local_448.data_._0_4_ = 0;
              testing::internal::CmpHelperNE<unsigned_int,unsigned_int>
                        ((internal *)&local_460,"pkt->data.frame.flags & 0x1u","0u",
                         (uint *)&local_468,(uint *)&local_448);
              if (local_460.data_._0_1_ == (internal)0x0) {
                testing::Message::Message((Message *)&local_468);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)
                           (CONCAT44(local_468.data_._4_4_,(aom_codec_err_t)local_468.data_) + 0x10)
                           ,"frame ",6);
                std::ostream::operator<<
                          ((void *)(CONCAT44(local_468.data_._4_4_,(aom_codec_err_t)local_468.data_)
                                   + 0x10),local_44c);
                pSVar6 = "";
                if (local_458 != (undefined8 *)0x0) {
                  pSVar6 = (SEARCH_METHODS *)*local_458;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_448,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
                           ,0x129,(char *)pSVar6);
                testing::internal::AssertHelper::operator=(&local_448,(Message *)&local_468);
                testing::internal::AssertHelper::~AssertHelper(&local_448);
                if ((long *)CONCAT44(local_468.data_._4_4_,(aom_codec_err_t)local_468.data_) !=
                    (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_468.data_._4_4_,
                                                 (aom_codec_err_t)local_468.data_) + 8))();
                }
              }
              puVar1 = local_458;
              if (local_458 != (undefined8 *)0x0) {
                if ((undefined8 *)*local_458 != local_458 + 2) {
                  operator_delete((undefined8 *)*local_458);
                }
                operator_delete(puVar1);
              }
            }
            local_44c = local_44c + 1;
          }
          bVar7 = iVar3 == 0;
          iVar3 = iVar3 + 1;
        } while (bVar7);
        iVar3 = 0;
      }
LAB_00679351:
      if ((iVar3 != 3) && (iVar3 != 0)) goto LAB_0067942b;
      lVar4 = local_3f8 + 8;
    } while (lVar4 != 0x18);
    local_470.data_._0_4_ = 2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_460,"frame_count","2",&local_44c,(int *)&local_470);
    if (local_460.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_470);
      if (local_458 == (undefined8 *)0x0) {
        pSVar6 = "";
      }
      else {
        pSVar6 = (SEARCH_METHODS *)*local_458;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_468,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
                 ,0x131,(char *)pSVar6);
      testing::internal::AssertHelper::operator=(&local_468,(Message *)&local_470);
      testing::internal::AssertHelper::~AssertHelper(&local_468);
      if (local_470.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_470.data_ + 8))();
      }
    }
    if (local_458 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_458 != local_458 + 2) {
        operator_delete((undefined8 *)*local_458);
      }
      operator_delete(local_458);
    }
LAB_0067942b:
    local_440.super_DummyVideoSource.super_VideoSource._vptr_VideoSource = local_400;
    aom_img_free(local_440.super_DummyVideoSource.img_);
    aom_codec_destroy(&local_3f0);
  }
  return;
}

Assistant:

TEST_P(AV1ResolutionChange, InvalidInputSize) {
  struct FrameSize {
    unsigned int width;
    unsigned int height;
  };
  static constexpr std::array<FrameSize, 3> kFrameSizes = { {
      { 1768, 0 },
      { 0, 200 },
      { 850, 200 },
  } };

  aom_codec_iface_t *iface = aom_codec_av1_cx();
  aom_codec_enc_cfg_t cfg;
  ASSERT_EQ(aom_codec_enc_config_default(iface, &cfg, usage_), AOM_CODEC_OK);

  // Resolution changes are only permitted with one pass encoding with no lag.
  cfg.g_pass = AOM_RC_ONE_PASS;
  cfg.g_lag_in_frames = 0;
  cfg.rc_end_usage = rc_mode_;

  aom_codec_ctx_t ctx;
  EXPECT_EQ(aom_codec_enc_init(&ctx, iface, &cfg, 0), AOM_CODEC_OK);
  std::unique_ptr<aom_codec_ctx_t, decltype(&aom_codec_destroy)> enc(
      &ctx, &aom_codec_destroy);
  EXPECT_EQ(aom_codec_control(enc.get(), AOME_SET_CPUUSED, cpu_used_),
            AOM_CODEC_OK);

  int frame_count = 0;
  ::libaom_test::RandomVideoSource video;
  video.Begin();
  constexpr int kNumFramesPerResolution = 2;
  for (const auto &frame_size : kFrameSizes) {
    cfg.g_w = frame_size.width;
    cfg.g_h = frame_size.height;
    if (cfg.g_w < 1 || cfg.g_w > 65536 || cfg.g_h < 1 || cfg.g_h > 65536) {
      EXPECT_EQ(aom_codec_enc_config_set(enc.get(), &cfg),
                AOM_CODEC_INVALID_PARAM);
      continue;
    }

    EXPECT_EQ(aom_codec_enc_config_set(enc.get(), &cfg), AOM_CODEC_OK);
    video.SetSize(cfg.g_w, cfg.g_h);

    aom_codec_iter_t iter;
    const aom_codec_cx_pkt_t *pkt;

    for (int i = 0; i < kNumFramesPerResolution; ++i) {
      video.Next();  // SetSize() does not call FillFrame().
      EXPECT_EQ(aom_codec_encode(enc.get(), video.img(), video.pts(),
                                 video.duration(), /*flags=*/0),
                AOM_CODEC_OK);

      iter = nullptr;
      while ((pkt = aom_codec_get_cx_data(enc.get(), &iter)) != nullptr) {
        ASSERT_EQ(pkt->kind, AOM_CODEC_CX_FRAME_PKT);
        // The frame following a resolution change should be a keyframe as the
        // change is too extreme to allow previous references to be used.
        if (i == 0 || usage_ == AOM_USAGE_ALL_INTRA) {
          EXPECT_NE(pkt->data.frame.flags & AOM_FRAME_IS_KEY, 0u)
              << "frame " << frame_count;
        }
        frame_count++;
      }
    }
  }

  EXPECT_EQ(frame_count, 2);
}